

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_CCtx_params params;
  ZSTD_CDict *cdict;
  ZSTD_CDict *pZVar1;
  size_t sVar2;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  U32 enableDedicatedDictSearch;
  void *alloc;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  byte bVar8;
  ulong uVar9;
  ZSTD_compressionParameters cParams;
  ZSTD_allocFunction in_stack_fffffffffffffe18;
  ZSTD_allocFunction p_Var10;
  ZSTD_freeFunction in_stack_fffffffffffffe20;
  ZSTD_freeFunction p_Var11;
  void *in_stack_fffffffffffffe28;
  void *pvVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [24];
  undefined1 in_stack_fffffffffffffe30 [152];
  undefined1 auVar15 [24];
  ZSTD_compressionParameters local_108;
  void *local_e8;
  ZSTD_CCtx_params local_e0;
  
  bVar8 = 0;
  memcpy(&local_e0,originalCctxParams,0xb0);
  enableDedicatedDictSearch = local_e0.enableDedicatedDictSearch;
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    local_e8 = dict;
    if (local_e0.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                (&local_108,&local_e0,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      uVar9 = CONCAT44(local_108.targetLength,local_108.minMatch);
      local_e0.cParams.strategy = local_108.strategy;
      local_e0.cParams.windowLog = local_108.windowLog;
      local_e0.cParams.chainLog = local_108.chainLog;
      local_e0.cParams.hashLog = local_108.hashLog;
      local_e0.cParams.searchLog = local_108.searchLog;
    }
    else {
      ZSTD_getCParams_internal(&local_108,local_e0.compressionLevel,0,dictSize,ZSTD_cpm_createCDict)
      ;
      uVar5 = local_108.hashLog + 2;
      if (2 < local_108.strategy - ZSTD_greedy) {
        uVar5 = local_108.hashLog;
      }
      local_e0.cParams.windowLog =
           ~-(uint)(local_e0.cParams.windowLog == 0) & local_e0.cParams.windowLog |
           local_108.windowLog & -(uint)(local_e0.cParams.windowLog == 0);
      local_e0.cParams.chainLog =
           ~-(uint)(local_e0.cParams.chainLog == 0) & local_e0.cParams.chainLog |
           local_108.chainLog & -(uint)(local_e0.cParams.chainLog == 0);
      local_e0.cParams.hashLog =
           ~-(uint)(local_e0.cParams.hashLog == 0) & local_e0.cParams.hashLog |
           uVar5 & -(uint)(local_e0.cParams.hashLog == 0);
      local_e0.cParams.searchLog =
           ~-(uint)(local_e0.cParams.searchLog == 0) & local_e0.cParams.searchLog |
           local_108.searchLog & -(uint)(local_e0.cParams.searchLog == 0);
      uVar9 = CONCAT44(-(uint)(local_e0.cParams.targetLength == 0),
                       -(uint)(local_e0.cParams.minMatch == 0));
      uVar9 = ~uVar9 & CONCAT44(local_e0.cParams.targetLength,local_e0.cParams.minMatch) |
              CONCAT44(local_108.targetLength,local_108.minMatch) & uVar9;
      local_e0.cParams.strategy = local_e0.cParams.strategy;
      if (local_e0.cParams.strategy == 0) {
        local_e0.cParams.strategy = local_108.strategy;
      }
    }
    if (((local_e0.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) ||
        (local_e0.cParams.hashLog <= local_e0.cParams.chainLog)) ||
       (0x18 < local_e0.cParams.chainLog)) {
      local_e0.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                (&local_108,&local_e0,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      uVar9 = CONCAT44(local_108.targetLength,local_108.minMatch);
      enableDedicatedDictSearch = 0;
      local_e0.cParams.strategy = local_108.strategy;
      local_e0.cParams.windowLog = local_108.windowLog;
      local_e0.cParams.chainLog = local_108.chainLog;
      local_e0.cParams.hashLog = local_108.hashLog;
      local_e0.cParams.searchLog = local_108.searchLog;
    }
    local_e0.cParams.minMatch = (uint)uVar9;
    local_e0.cParams.targetLength = (uint)(uVar9 >> 0x20);
    useRowMatchFinder = local_e0.useRowMatchFinder;
    if ((local_e0.useRowMatchFinder == ZSTD_urm_auto) &&
       (useRowMatchFinder = ZSTD_urm_disableRowMatchFinder,
       0xfffffffc < local_e0.cParams.strategy - ZSTD_btlazy2)) {
      useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (local_e0.cParams.windowLog < 0xf);
    }
    local_e0.useRowMatchFinder = useRowMatchFinder;
    local_108.chainLog = local_e0.cParams.chainLog;
    local_108.windowLog = local_e0.cParams.windowLog;
    local_108.minMatch = local_e0.cParams.minMatch;
    local_108.targetLength = local_e0.cParams.targetLength;
    local_108.hashLog = local_e0.cParams.hashLog;
    local_108.searchLog = local_e0.cParams.searchLog;
    if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
        (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
      sVar2 = ZSTD_sizeof_matchState(&local_108,useRowMatchFinder,enableDedicatedDictSearch,0);
      lVar3 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2c90;
      if (dictLoadMethod == ZSTD_dlm_byRef) {
        lVar3 = 0x2c90;
      }
      p_Var10 = customMem.customAlloc;
      p_Var11 = customMem.customFree;
      pvVar12 = customMem.opaque;
      cdict = (ZSTD_CDict *)ZSTD_customMalloc(lVar3 + sVar2,customMem);
      if (cdict == (ZSTD_CDict *)0x0) {
        cdict = (ZSTD_CDict *)0x0;
        ZSTD_customFree((void *)0x0,customMem);
      }
      else {
        pvVar4 = (void *)((long)&cdict->dictContent + lVar3 + sVar2);
        pZVar1 = cdict + 1;
        (cdict->workspace).workspace = cdict;
        (cdict->workspace).workspaceEnd = pvVar4;
        (cdict->workspace).objectEnd = pZVar1;
        (cdict->workspace).tableEnd = pZVar1;
        (cdict->workspace).tableValidEnd = pZVar1;
        (cdict->workspace).allocStart = pvVar4;
        (cdict->workspace).allocFailed = '\0';
        (cdict->workspace).workspaceOversizedDuration = 0;
        (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
        (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
        (cdict->customMem).customAlloc = customMem.customAlloc;
        (cdict->customMem).customFree = customMem.customFree;
        (cdict->customMem).opaque = customMem.opaque;
        cdict->compressionLevel = 0;
        cdict->useRowMatchFinder = useRowMatchFinder;
        customMem.customAlloc = p_Var10;
        customMem.customFree = p_Var11;
        customMem.opaque = pvVar12;
      }
    }
    else {
      cdict = (ZSTD_CDict *)0x0;
      customMem.customAlloc = in_stack_fffffffffffffe18;
      customMem.customFree = in_stack_fffffffffffffe20;
      customMem.opaque = in_stack_fffffffffffffe28;
    }
    pZVar6 = &local_e0;
    puVar7 = (undefined8 *)&stack0xfffffffffffffe18;
    for (lVar3 = 0x16; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *(undefined8 *)pZVar6;
      pZVar6 = (ZSTD_CCtx_params *)((long)pZVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    params.cParams._4_8_ = customMem.customFree;
    params._0_8_ = customMem.customAlloc;
    params.cParams._12_8_ = customMem.opaque;
    auVar13 = in_stack_fffffffffffffe30._8_12_;
    auVar14 = in_stack_fffffffffffffe30._72_24_;
    auVar15 = in_stack_fffffffffffffe30._128_24_;
    params.cParams.targetLength = in_stack_fffffffffffffe30._0_4_;
    params.cParams.strategy = in_stack_fffffffffffffe30._4_4_;
    params.fParams.contentSizeFlag = auVar13._0_4_;
    params.fParams.checksumFlag = auVar13._4_4_;
    params.fParams.noDictIDFlag = auVar13._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe30._20_4_;
    params.forceWindow = in_stack_fffffffffffffe30._24_4_;
    params._52_4_ = in_stack_fffffffffffffe30._28_4_;
    params.targetCBlockSize = in_stack_fffffffffffffe30._32_8_;
    params.srcSizeHint = in_stack_fffffffffffffe30._40_4_;
    params.attachDictPref = in_stack_fffffffffffffe30._44_4_;
    params.literalCompressionMode = in_stack_fffffffffffffe30._48_4_;
    params.nbWorkers = in_stack_fffffffffffffe30._52_4_;
    params.jobSize = in_stack_fffffffffffffe30._56_8_;
    params.overlapLog = in_stack_fffffffffffffe30._64_4_;
    params.rsyncable = in_stack_fffffffffffffe30._68_4_;
    params.ldmParams.enableLdm = auVar14._0_4_;
    params.ldmParams.hashLog = auVar14._4_4_;
    params.ldmParams.bucketSizeLog = auVar14._8_4_;
    params.ldmParams.minMatchLength = auVar14._12_4_;
    params.ldmParams.hashRateLog = auVar14._16_4_;
    params.ldmParams.windowLog = auVar14._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffe30._96_4_;
    params.inBufferMode = in_stack_fffffffffffffe30._100_4_;
    params.outBufferMode = in_stack_fffffffffffffe30._104_4_;
    params.blockDelimiters = in_stack_fffffffffffffe30._108_4_;
    params.validateSequences = in_stack_fffffffffffffe30._112_4_;
    params.splitBlocks = in_stack_fffffffffffffe30._116_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffe30._120_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffe30._124_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar15._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar15._8_8_;
    params.customMem.opaque = (void *)auVar15._16_8_;
    sVar2 = ZSTD_initCDict_internal(cdict,local_e8,dictSize,dictLoadMethod,dictContentType,params);
    if (sVar2 < 0xffffffffffffff89) {
      return cdict;
    }
    ZSTD_freeCDict(cdict);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTDLIB_API ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}